

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# containers.h
# Opt level: O2

void __thiscall
pbrt::
HashMap<pbrt::LightHandle,_pbrt::LightBVHNode_*,_pbrt::LightHandleHash,_pstd::pmr::polymorphic_allocator<pstd::optional<std::pair<pbrt::LightHandle,_pbrt::LightBVHNode_*>_>_>_>
::Insert(HashMap<pbrt::LightHandle,_pbrt::LightBVHNode_*,_pbrt::LightHandleHash,_pstd::pmr::polymorphic_allocator<pstd::optional<std::pair<pbrt::LightHandle,_pbrt::LightBVHNode_*>_>_>_>
         *this,LightHandle *key,LightBVHNode **value)

{
  size_t sVar1;
  optional<std::pair<pbrt::LightHandle,_pbrt::LightBVHNode_*>_> *poVar2;
  size_t sVar3;
  pair<pbrt::LightHandle,_pbrt::LightBVHNode_*> local_28;
  
  sVar1 = FindOffset(this,key);
  poVar2 = (this->table).ptr;
  if ((poVar2[sVar1].set == false) &&
     (sVar3 = this->nStored + 1, this->nStored = sVar3, (this->table).nStored < sVar3 * 3)) {
    Grow(this);
    sVar1 = FindOffset(this,key);
    poVar2 = (this->table).ptr;
  }
  local_28.first =
       (LightHandle)
       (key->
       super_TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
       ).bits;
  local_28.second = *value;
  pstd::optional<std::pair<pbrt::LightHandle,_pbrt::LightBVHNode_*>_>::operator=
            (poVar2 + sVar1,&local_28);
  return;
}

Assistant:

void Insert(const Key &key, const Value &value) {
        size_t offset = FindOffset(key);
        if (table[offset].has_value() == false) {
            // Not there already; possibly grow.
            if (3 * ++nStored > capacity()) {
                Grow();
                offset = FindOffset(key);
            }
        }
        table[offset] = std::make_pair(key, value);
    }